

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::PrintBuffer(PF_BufferMgr *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Buffer contains ",0x10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->numPages);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," pages of size ",0xf);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->pageSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Contents in order from most recently used to ",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"least recently used.\n",0x15);
  iVar4 = this->first;
  if (iVar4 != -1) {
    do {
      iVar1 = this->bufTable[iVar4].next;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," :: \n",5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  fd = ",7);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->bufTable[iVar4].fd);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  pageNum = ",0xc);
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,this->bufTable[iVar4].pageNum);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  bDirty = ",0xb);
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,this->bufTable[iVar4].bDirty);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  pinCount = ",0xd);
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,this->bufTable[iVar4].pinCount);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      iVar4 = iVar1;
    } while (iVar1 != -1);
    if (this->first != -1) {
      pcVar5 = "All remaining slots are free.\n";
      lVar3 = 0x1e;
      goto LAB_00103343;
    }
  }
  pcVar5 = "Buffer is empty!\n";
  lVar3 = 0x11;
LAB_00103343:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar3);
  return 0;
}

Assistant:

RC PF_BufferMgr::PrintBuffer()
{
   cout << "Buffer contains " << numPages << " pages of size "
      << pageSize <<".\n";
   cout << "Contents in order from most recently used to "
      << "least recently used.\n";

   int slot, next;
   slot = first;
   while (slot != INVALID_SLOT) {
      next = bufTable[slot].next;
      cout << slot << " :: \n";
      cout << "  fd = " << bufTable[slot].fd << "\n";
      cout << "  pageNum = " << bufTable[slot].pageNum << "\n";
      cout << "  bDirty = " << bufTable[slot].bDirty << "\n";
      cout << "  pinCount = " << bufTable[slot].pinCount << "\n";
      slot = next;
   }

   if (first==INVALID_SLOT)
      cout << "Buffer is empty!\n";
   else
      cout << "All remaining slots are free.\n";

   return 0;
}